

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O3

void anm_write(anm_archive_t *anm,char *filename,uint version)

{
  short sVar1;
  undefined4 uVar2;
  long *plVar3;
  char *pcVar4;
  uint *puVar5;
  ulong *buffer;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  FILE *__stream;
  long lVar9;
  size_t sVar10;
  long lVar11;
  size_t sVar12;
  list_node_t *plVar13;
  long *plVar14;
  uint uVar15;
  size_t size;
  size_t sVar16;
  undefined8 *puVar17;
  ulong uVar18;
  undefined8 *puVar19;
  short *buffer_00;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  anm_instr0_t new_instr;
  undefined8 local_78;
  long local_70;
  uint local_68;
  uint local_64;
  long *local_60;
  list_node_t *local_58;
  long *local_50;
  long local_48;
  ulong local_40;
  size_t local_38;
  
  __stream = fopen(filename,"wb");
  if (__stream == (FILE *)0x0) {
    anm_write_cold_1();
    uVar7 = *(ulong *)filename;
    *(ulong *)filename =
         (ulong)(CONCAT24((short)((uint)*(undefined4 *)((long)filename + 4) >> 0x10),
                          *(undefined4 *)((long)filename + 4)) & 0xffff0000ffff);
    *(undefined4 *)((long)filename + 8) = 0;
    *(ulong *)((long)filename + 0xc) =
         (ulong)CONCAT24((short)((uint)*(undefined4 *)((long)filename + 10) >> 0x10),
                         *(undefined4 *)((long)filename + 10)) & 0xffffffff0000ffff;
    uVar2 = *(undefined4 *)((long)filename + 0x14);
    *(uint *)((long)filename + 0x14) = (uint)*(ushort *)((long)filename + 0xe);
    uVar18 = *(ulong *)((long)filename + 0x18);
    uVar6 = *(ulong *)((long)filename + 0x20);
    *(ulong *)((long)filename + 0x20) =
         (ulong)CONCAT24((short)((uint)uVar2 >> 0x10),uVar2) & 0xffffffff0000ffff;
    *(undefined4 *)((long)filename + 0x18) = 0;
    *(int *)((long)filename + 0x1c) = (int)*(ulong *)((long)filename + 0x10);
    *(ulong *)((long)filename + 0x2c) = uVar18;
    *(ulong *)((long)filename + 0x34) = uVar6;
    uVar18 = *(ulong *)((long)filename + 0x28);
    *(int *)((long)filename + 0x28) = (int)uVar7;
    *(int *)((long)filename + 0x3c) = (int)uVar18;
    return;
  }
  plVar13 = (anm->entries).head;
  if (plVar13 != (list_node_t *)0x0) {
    sVar16 = 0x14;
    local_38 = sVar16;
    if (version == 0x13) {
      sVar16 = 0x28;
      local_38 = sVar16;
    }
    do {
      plVar3 = (long *)plVar13->data;
      local_58 = plVar13;
      lVar9 = file_tell((FILE *)__stream);
      fflush(__stream);
      sVar10 = strlen((char *)plVar3[2]);
      local_50 = plVar3 + 7;
      local_68 = 0xffffffff;
      uVar15 = 0;
      plVar14 = local_50;
      do {
        local_40 = (ulong)uVar15;
        plVar14 = (long *)*plVar14;
        local_68 = local_68 + 1;
        uVar15 = uVar15 + 1;
      } while (plVar14 != (long *)0x0);
      local_60 = plVar3 + 9;
      local_64 = 0xffffffff;
      plVar14 = local_60;
      do {
        plVar14 = (long *)*plVar14;
        local_64 = local_64 + 1;
      } while (plVar14 != (long *)0x0);
      file_seek((FILE *)__stream,lVar9 + (ulong)local_68 * 4 + (ulong)local_64 * 8 + 0x40);
      lVar11 = file_tell((FILE *)__stream);
      *(int *)(*plVar3 + 0x1c) = (int)lVar11 - (int)lVar9;
      pcVar4 = (char *)plVar3[2];
      local_70 = lVar9;
      sVar12 = strlen(pcVar4);
      file_write((FILE *)__stream,pcVar4,sVar12);
      file_write((FILE *)__stream,"",0x10 - (ulong)((uint)sVar10 & 0xf));
      if (((char *)plVar3[3] != (char *)0x0) && (*(int *)(*plVar3 + 0x28) == 0)) {
        sVar10 = strlen((char *)plVar3[3]);
        lVar9 = file_tell((FILE *)__stream);
        *(int *)(*plVar3 + 0x24) = (int)lVar9 - (int)local_70;
        pcVar4 = (char *)plVar3[3];
        sVar12 = strlen(pcVar4);
        file_write((FILE *)__stream,pcVar4,sVar12);
        file_write((FILE *)__stream,"",0x10 - (ulong)((uint)sVar10 & 0xf));
      }
      local_48 = file_tell((FILE *)__stream);
      for (puVar19 = (undefined8 *)*local_50; puVar19 != (undefined8 *)0x0;
          puVar19 = (undefined8 *)*puVar19) {
        file_write((FILE *)__stream,(void *)puVar19[2],sVar16);
      }
      lVar9 = local_70;
      for (puVar19 = (undefined8 *)*local_60; iVar8 = (int)lVar9, puVar19 != (undefined8 *)0x0;
          puVar19 = (undefined8 *)*puVar19) {
        lVar11 = puVar19[2];
        lVar9 = file_tell((FILE *)__stream);
        *(int *)(*(long *)(lVar11 + 8) + 4) = (int)lVar9 - iVar8;
        for (puVar17 = *(undefined8 **)(lVar11 + 0x20); sVar16 = local_38, lVar9 = local_70,
            uVar18 = local_78, puVar17 != (undefined8 *)0x0; puVar17 = (undefined8 *)*puVar17) {
          buffer_00 = (short *)puVar17[2];
          if (*(int *)(*plVar3 + 0x28) == 0) {
            local_78._4_4_ = SUB84(uVar18,4);
            local_78._0_4_ = CONCAT13((char)buffer_00[1],CONCAT12((char)*buffer_00,buffer_00[2]));
            file_write((FILE *)__stream,&local_78,4);
            sVar16 = local_78 >> 0x18 & 0xff;
            if (sVar16 != 0) {
              buffer_00 = buffer_00 + 4;
              goto LAB_0010fbfb;
            }
          }
          else {
            if (*buffer_00 == -1) {
              buffer_00[1] = 0;
              sVar16 = 8;
            }
            else {
              sVar1 = buffer_00[1];
              buffer_00[1] = sVar1 + 8U;
              sVar16 = (size_t)(ushort)(sVar1 + 8U);
            }
LAB_0010fbfb:
            file_write((FILE *)__stream,buffer_00,sVar16);
          }
        }
        if (*(int *)(lVar11 + 0x50) == 0) {
          if (*(int *)(*plVar3 + 0x28) == 0) {
            local_78 = local_78 & 0xffffffff00000000;
            size = 4;
          }
          else {
            local_78 = 0xffff;
            size = 8;
          }
          file_write((FILE *)__stream,&local_78,size);
        }
      }
      if (*(short *)(*plVar3 + 0x34) != 0) {
        lVar11 = file_tell((FILE *)__stream);
        *(int *)(*plVar3 + 0x30) = (int)lVar11 - iVar8;
        file_write((FILE *)__stream,(void *)plVar3[1],0x10);
        file_write((FILE *)__stream,(void *)plVar3[0xb],(ulong)*(uint *)(plVar3[1] + 0xc));
      }
      if (local_58->next == (list_node_t *)0x0) {
        uVar15 = 0;
      }
      else {
        lVar11 = file_tell((FILE *)__stream);
        uVar15 = (int)lVar11 - iVar8;
      }
      puVar5 = (uint *)*plVar3;
      puVar5[0xe] = uVar15;
      *puVar5 = local_68;
      puVar5[1] = local_64;
      file_seek((FILE *)__stream,lVar9);
      buffer = (ulong *)*plVar3;
      if ((uint)buffer[5] < 7) {
        file_write((FILE *)__stream,buffer,0x40);
      }
      else {
        uVar2 = *(undefined4 *)((long)buffer + 0x3c);
        uVar18 = *(ulong *)((long)buffer + 0x2c);
        uVar6 = *(ulong *)((long)buffer + 0x34);
        *(undefined8 *)((long)buffer + 0x2c) = 0;
        *(undefined8 *)((long)buffer + 0x34) = 0;
        *(undefined4 *)((long)buffer + 0x3c) = 0;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = *buffer;
        auVar20 = pshuflw(auVar20,auVar20,0xe8);
        *(int *)((long)buffer + 4) = auVar20._0_4_;
        *(undefined2 *)(buffer + 1) = 0;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = *(ulong *)((long)buffer + 0xc);
        auVar20 = pshuflw(auVar21,auVar21,0xe8);
        *(int *)((long)buffer + 10) = auVar20._0_4_;
        *(undefined2 *)((long)buffer + 0xe) = *(undefined2 *)((long)buffer + 0x14);
        *(undefined4 *)(buffer + 2) = *(undefined4 *)((long)buffer + 0x1c);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = buffer[4];
        auVar20 = pshuflw(auVar22,auVar22,0xe8);
        *(int *)((long)buffer + 0x14) = auVar20._0_4_;
        *(uint *)buffer = (uint)buffer[5];
        buffer[3] = uVar18;
        buffer[4] = uVar6;
        *(undefined4 *)(buffer + 5) = uVar2;
        file_write((FILE *)__stream,(void *)*plVar3,0x40);
        convert_header_to_old((anm_header06_t *)*plVar3);
      }
      if (local_68 != 0) {
        iVar8 = (int)local_48 - (int)local_70;
        uVar18 = local_40;
        do {
          local_78 = CONCAT44(local_78._4_4_,iVar8);
          file_write((FILE *)__stream,&local_78,4);
          iVar8 = iVar8 + (int)sVar16;
          uVar15 = (int)uVar18 - 1;
          uVar18 = (ulong)uVar15;
        } while (uVar15 != 0);
      }
      for (puVar19 = (undefined8 *)*local_60; puVar19 != (undefined8 *)0x0;
          puVar19 = (undefined8 *)*puVar19) {
        file_write((FILE *)__stream,*(void **)(puVar19[2] + 8),8);
      }
      file_seek((FILE *)__stream,local_70 + (ulong)*(uint *)(*plVar3 + 0x38));
      plVar13 = local_58->next;
    } while (plVar13 != (list_node_t *)0x0);
  }
  fclose(__stream);
  return;
}

Assistant:

static void
anm_write(
    anm_archive_t* anm,
    const char* filename,
    unsigned version)
{
    FILE* stream;

    stream = fopen(filename, "wb");
    if (!stream) {
        fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
            argv0, filename, strerror(errno));
        exit(1);
    }

    anm_entry_t* entry;
    list_for_each(&anm->entries, entry) {
        sprite19_t* sprite;
        anm_script_t* script;
        long base = file_tell(stream);
        fflush(stream);
        unsigned int namepad = 0;
        static const char padding[16] = "";
        unsigned int j;
        unsigned int spriteoffset;

        namepad = (16 - strlen(entry->name) % 16);

        unsigned int sprite_count = 0;
        list_for_each(&entry->sprites, sprite)
            ++sprite_count;

        unsigned int script_count = 0;
        list_for_each(&entry->scripts, script)
            ++script_count;

        file_seek(stream, base +
                          sizeof(anm_header06_t) +
                          sprite_count * sizeof(uint32_t) +
                          script_count * sizeof(anm_offset_t));

        entry->header->nameoffset = file_tell(stream) - base;
        file_write(stream, entry->name, strlen(entry->name));
        file_write(stream, padding, namepad);

        if (entry->name2 && entry->header->version == 0) {
            namepad = (16 - strlen(entry->name2) % 16);

            entry->header->y = file_tell(stream) - base;
            file_write(stream, entry->name2, strlen(entry->name2));
            file_write(stream, padding, namepad);
        }

        /* NEWHU: 19 */
        const unsigned spritesize = version == 19 ? sizeof(sprite19_t) : sizeof(sprite_t);
        spriteoffset = file_tell(stream) - base;

        list_for_each(&entry->sprites, sprite)
            file_write(stream, sprite, spritesize);

        list_for_each(&entry->scripts, script) {
            script->offset->offset = file_tell(stream) - base;

            anm_instr_t* instr;
            list_for_each(&script->raw_instrs, instr) {
                if (entry->header->version == 0) {
                    anm_instr0_t new_instr;
                    new_instr.time = instr->time;
                    new_instr.type = instr->type;
                    new_instr.length = instr->length;
                    file_write(stream, &new_instr, sizeof(new_instr));
                    if (new_instr.length) {
                        file_write(stream,
                            instr->data,
                            new_instr.length);
                    }
                } else {
                    if (instr->type == 0xffff) {
                        instr->length = 0;
                        file_write(stream, instr, sizeof(*instr));
                    } else {
                        instr->length += sizeof(*instr);
                        file_write(stream, instr, instr->length);
                    }
                }
            }

            if (!script->no_sentinel) {
                if (entry->header->version == 0) {
                    anm_instr0_t sentinel = { 0, 0, 0 };
                    file_write(stream, &sentinel, sizeof(sentinel));
                } else {
                    anm_instr_t sentinel = { 0xffff, 0, 0, 0 };
                    file_write(stream, &sentinel, sizeof(sentinel));
                }
            }
        }

        if (entry->header->hasdata) {
            entry->header->thtxoffset = file_tell(stream) - base;

            file_write(stream, entry->thtx, sizeof(thtx_header_t));
            file_write(stream, entry->data, entry->thtx->size);
        }

        if (list_is_last_iteration())
            entry->header->nextoffset = 0;
        else
            entry->header->nextoffset = file_tell(stream) - base;

        entry->header->sprites = sprite_count;
        entry->header->scripts = script_count;

        file_seek(stream, base);

        if (entry->header->version >= 7) {
            convert_header_to_11(entry->header);

            file_write(stream, entry->header, sizeof(anm_header06_t));
            convert_header_to_old(entry->header);
        } else {
            file_write(stream, entry->header, sizeof(anm_header06_t));
        }

        for (j = 0; j < sprite_count; ++j) {
            uint32_t ofs = spriteoffset + j * spritesize;
            file_write(stream, &ofs, sizeof(uint32_t));
        }

        list_for_each(&entry->scripts, script) {
            file_write(stream, script->offset, sizeof(*script->offset));
        }

        file_seek(stream, base + entry->header->nextoffset);
    }

    fclose(stream);
}